

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int eval_path_expr(lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,
                  lyxp_set *set,int options)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  int local_44;
  int local_40;
  int ret;
  int all_desc;
  int options_local;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  
  switch(exp->tokens[*exp_idx]) {
  case LYXP_TOKEN_PAR1:
    if ('\x02' < ly_log_level) {
      pcVar2 = "skipped";
      if (set != (lyxp_set *)0x0) {
        pcVar2 = "parsed";
      }
      pcVar3 = print_token(exp->tokens[*exp_idx]);
      ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_path_expr",pcVar2,pcVar3,
                 (ulong)exp->expr_pos[*exp_idx]);
    }
    *exp_idx = *exp_idx + 1;
    iVar1 = eval_expr(exp,exp_idx,cur_node,param_4,set,options);
    if (iVar1 != 0) {
      return iVar1;
    }
    if ('\x02' < ly_log_level) {
      pcVar2 = "skipped";
      if (set != (lyxp_set *)0x0) {
        pcVar2 = "parsed";
      }
      pcVar3 = print_token(exp->tokens[*exp_idx]);
      ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_path_expr",pcVar2,pcVar3,
                 (ulong)exp->expr_pos[*exp_idx]);
    }
    *exp_idx = *exp_idx + 1;
    break;
  default:
    pcVar2 = print_token(exp->tokens[*exp_idx]);
    ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar2,exp->expr + exp->expr_pos[*exp_idx]);
    return -1;
  case LYXP_TOKEN_DOT:
  case LYXP_TOKEN_DDOT:
  case LYXP_TOKEN_AT:
  case LYXP_TOKEN_NAMETEST:
  case LYXP_TOKEN_NODETYPE:
    iVar1 = eval_relative_location_path(exp,exp_idx,cur_node,param_4,0,set,options);
    goto joined_r0x0019d590;
  case LYXP_TOKEN_FUNCNAME:
    if ((set == (lyxp_set *)0x0) || ((options & 0x1cU) != 0)) {
      if (set != (lyxp_set *)0x0) {
        if ((exp->tok_len[*exp_idx] == '\a') &&
           (iVar1 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"current",7), iVar1 == 0)) {
          xpath_current((lyxp_set **)0x0,0,cur_node,param_4,set,options);
        }
        else {
          if ((exp->tok_len[*exp_idx] == '\x05') &&
             (iVar1 = strncmp(exp->expr + exp->expr_pos[*exp_idx],"deref",5), iVar1 == 0)) {
            iVar1 = eval_function_call(exp,exp_idx,cur_node,param_4,set,options);
            if (iVar1 != 0) {
              return iVar1;
            }
            break;
          }
          set_snode_clear_ctx(set);
        }
      }
      local_44 = eval_function_call(exp,exp_idx,cur_node,param_4,(lyxp_set *)0x0,options);
    }
    else {
      local_44 = eval_function_call(exp,exp_idx,cur_node,param_4,set,options);
    }
    if (local_44 != 0) {
      return local_44;
    }
    break;
  case LYXP_TOKEN_OPERATOR_PATH:
    iVar1 = eval_absolute_location_path(exp,exp_idx,cur_node,param_4,set,options);
joined_r0x0019d590:
    if (iVar1 != 0) {
      return iVar1;
    }
    return 0;
  case LYXP_TOKEN_LITERAL:
    if ((set == (lyxp_set *)0x0) || ((options & 0x1cU) != 0)) {
      if (set != (lyxp_set *)0x0) {
        set_snode_clear_ctx(set);
      }
      eval_literal(exp,exp_idx,(lyxp_set *)0x0);
    }
    else {
      eval_literal(exp,exp_idx,set);
    }
    break;
  case LYXP_TOKEN_NUMBER:
    if ((set == (lyxp_set *)0x0) || ((options & 0x1cU) != 0)) {
      if (set != (lyxp_set *)0x0) {
        set_snode_clear_ctx(set);
      }
      local_44 = eval_number(exp,exp_idx,(lyxp_set *)0x0);
    }
    else {
      local_44 = eval_number(exp,exp_idx,set);
    }
    if (local_44 != 0) {
      return local_44;
    }
  }
  while( true ) {
    bVar4 = false;
    if (*exp_idx < exp->used) {
      bVar4 = exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1;
    }
    if (!bVar4) break;
    iVar1 = eval_predicate(exp,exp_idx,cur_node,param_4,set,options);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  if ((*exp_idx < exp->used) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH)) {
    if (exp->tok_len[*exp_idx] == '\x01') {
      local_40 = 0;
    }
    else {
      if (exp->tok_len[*exp_idx] != '\x02') {
        __assert_fail("exp->tok_len[*exp_idx] == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                      ,0x19d6,
                      "int eval_path_expr(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                     );
      }
      local_40 = 1;
    }
    if ('\x02' < ly_log_level) {
      pcVar2 = "skipped";
      if (set != (lyxp_set *)0x0) {
        pcVar2 = "parsed";
      }
      pcVar3 = print_token(exp->tokens[*exp_idx]);
      ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_path_expr",pcVar2,pcVar3,
                 (ulong)exp->expr_pos[*exp_idx]);
    }
    *exp_idx = *exp_idx + 1;
    iVar1 = eval_relative_location_path(exp,exp_idx,cur_node,param_4,local_40,set,options);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  return 0;
}

Assistant:

static int
eval_path_expr(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
               struct lyxp_set *set, int options)
{
    int all_desc, ret;

    switch (exp->tokens[*exp_idx]) {
    case LYXP_TOKEN_PAR1:
        /* '(' Expr ')' */

        /* '(' */
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        /* Expr */
        ret = eval_expr(exp, exp_idx, cur_node, local_mod, set, options);
        if (ret) {
            return ret;
        }

        /* ')' */
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        goto predicate;

    case LYXP_TOKEN_DOT:
    case LYXP_TOKEN_DDOT:
    case LYXP_TOKEN_AT:
    case LYXP_TOKEN_NAMETEST:
    case LYXP_TOKEN_NODETYPE:
        /* RelativeLocationPath */
        ret = eval_relative_location_path(exp, exp_idx, cur_node, local_mod, 0, set, options);
        if (ret) {
            return ret;
        }
        break;

    case LYXP_TOKEN_FUNCNAME:
        /* FunctionCall */
        if (!set || (options & LYXP_SNODE_ALL)) {
            if (set) {
                /* the only function returning node-set - thus relevant */
                if ((exp->tok_len[*exp_idx] == 7) && !strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "current", 7)) {
                    xpath_current(NULL, 0, cur_node, local_mod, set, options);
                } else if ((exp->tok_len[*exp_idx] == 5) && !strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "deref", 5)) {
                    ret = eval_function_call(exp, exp_idx, cur_node, local_mod, set, options);
                    if (ret) {
                        return ret;
                    }
                    goto predicate;
                } else {
                    set_snode_clear_ctx(set);
                }
            }
            ret = eval_function_call(exp, exp_idx, cur_node, local_mod, NULL, options);
        } else {
            ret = eval_function_call(exp, exp_idx, cur_node, local_mod, set, options);
        }
        if (ret) {
            return ret;
        }

        goto predicate;

    case LYXP_TOKEN_OPERATOR_PATH:
        /* AbsoluteLocationPath */
        ret = eval_absolute_location_path(exp, exp_idx, cur_node, local_mod, set, options);
        if (ret) {
            return ret;
        }
        break;

    case LYXP_TOKEN_LITERAL:
        /* Literal */
        if (!set || (options & LYXP_SNODE_ALL)) {
            if (set) {
                set_snode_clear_ctx(set);
            }
            eval_literal(exp, exp_idx, NULL);
        } else {
            eval_literal(exp, exp_idx, set);
        }

        goto predicate;

    case LYXP_TOKEN_NUMBER:
        /* Number */
        if (!set || (options & LYXP_SNODE_ALL)) {
            if (set) {
                set_snode_clear_ctx(set);
            }
            ret = eval_number(exp, exp_idx, NULL);
        } else {
            ret = eval_number(exp, exp_idx, set);
        }
        if (ret) {
            return ret;
        }

        goto predicate;

    default:
        LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
               print_token(exp->tokens[*exp_idx]), &exp->expr[exp->expr_pos[*exp_idx]]);
        return -1;
    }

    return EXIT_SUCCESS;

predicate:
    /* Predicate* */
    while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
        ret = eval_predicate(exp, exp_idx, cur_node, local_mod, set, options);
        if (ret) {
            return ret;
        }
    }

    /* ('/' or '//') RelativeLocationPath */
    if ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH)) {

        /* evaluate '/' or '//' */
        if (exp->tok_len[*exp_idx] == 1) {
            all_desc = 0;
        } else {
            assert(exp->tok_len[*exp_idx] == 2);
            all_desc = 1;
        }

        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        ret = eval_relative_location_path(exp, exp_idx, cur_node, local_mod, all_desc, set, options);
        if (ret) {
            return ret;
        }
    }

    return EXIT_SUCCESS;
}